

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_2x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  memset(data,0,0x100);
  for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
    bVar3 = *(byte *)(*(long *)((long)sample_data + lVar8) + (ulong)start_col);
    bVar4 = *(byte *)(*(long *)((long)sample_data + lVar8) + 1 + (ulong)start_col);
    data[lVar8] = ((uint)bVar4 + (uint)bVar3) * 8 + -0x800;
    data[lVar8 + 1] = ((uint)bVar3 - (uint)bVar4) * 8;
  }
  for (lVar8 = 0; (int)lVar8 != 2; lVar8 = lVar8 + 1) {
    iVar1 = data[lVar8 + 0x18] + data[lVar8];
    iVar2 = data[lVar8 + 0x10] + data[lVar8 + 8];
    lVar5 = (long)(data[lVar8] - data[lVar8 + 0x18]);
    lVar6 = (long)(data[lVar8 + 8] - data[lVar8 + 0x10]);
    data[lVar8] = iVar2 + iVar1;
    data[lVar8 + 0x10] = iVar1 - iVar2;
    lVar7 = (lVar6 + lVar5) * 0x1151;
    data[lVar8 + 8] = (DCTELEM)(lVar5 * 0x187e + lVar7 + 0x1000U >> 0xd);
    data[lVar8 + 0x18] = (DCTELEM)(lVar7 + lVar6 * 0x1fffffffc4df + 0x1000U >> 0xd);
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_2x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */
  /* We must also scale the output by (8/2)*(8/4) = 2**3, which we add here. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]);
    tmp1 = GETJSAMPLE(elemptr[1]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp0 + tmp1 - 2 * CENTERJSAMPLE) << 3);

    /* Odd part */

    dataptr[1] = (DCTELEM) ((tmp0 - tmp1) << 3);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * 4-point FDCT kernel,
   * cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT].
   */

  dataptr = data;
  for (ctr = 0; ctr < 2; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3];
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) (tmp0 + tmp1);
    dataptr[DCTSIZE*2] = (DCTELEM) (tmp0 - tmp1);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}